

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status
fdb_open_for_compactor
          (fdb_file_handle **ptr_fhandle,char *filename,fdb_config *fconfig,list *cmp_func_list)

{
  fdb_status fVar1;
  fdb_file_handle *fhandle;
  fdb_kvs_handle *root;
  
  fhandle = (fdb_file_handle *)calloc(1,0x28);
  fVar1 = FDB_RESULT_ALLOC_FAIL;
  if (fhandle != (fdb_file_handle *)0x0) {
    root = (fdb_kvs_handle *)calloc(1,0x208);
    if (root == (fdb_kvs_handle *)0x0) {
      free(fhandle);
    }
    else {
      LOCK();
      (root->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      UNLOCK();
      root->shandle = (snap_handle *)0x0;
      fdb_file_handle_init(fhandle,root);
      if ((cmp_func_list != (list *)0x0) && (cmp_func_list->head != (list_elem *)0x0)) {
        fdb_file_handle_clone_cmp_func_list(fhandle,cmp_func_list);
      }
      fVar1 = _fdb_open(root,filename,FDB_VFILENAME,fconfig);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        *ptr_fhandle = fhandle;
        filemgr_fhandle_add(root->file,fhandle);
      }
      else {
        *ptr_fhandle = (fdb_file_handle *)0x0;
        free(root);
        fdb_file_handle_free(fhandle);
      }
    }
  }
  return fVar1;
}

Assistant:

fdb_status fdb_open_for_compactor(fdb_file_handle **ptr_fhandle,
                                  const char *filename,
                                  fdb_config *fconfig,
                                  struct list *cmp_func_list)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_file_handle *fhandle;
    fdb_kvs_handle *handle;

    fhandle = (fdb_file_handle*)calloc(1, sizeof(fdb_file_handle));
    if (!fhandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        free(fhandle);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->shandle = NULL;

    fdb_file_handle_init(fhandle, handle);
    if (cmp_func_list && list_begin(cmp_func_list)) {
        fdb_file_handle_clone_cmp_func_list(fhandle, cmp_func_list);
    }
    fdb_status fs = _fdb_open(handle, filename, FDB_VFILENAME, fconfig);
    if (fs == FDB_RESULT_SUCCESS) {
        *ptr_fhandle = fhandle;
        filemgr_fhandle_add(handle->file, fhandle);
    } else {
        *ptr_fhandle = NULL;
        free(handle);
        fdb_file_handle_free(fhandle);
    }
    return fs;
}